

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeReader::Read
          (CordRepBtreeReader *this,size_t n,size_t chunk_size,CordRep **tree)

{
  CordRep *pCVar1;
  string_view sVar2;
  size_t local_a0;
  string_view local_80;
  ulong local_70;
  size_t consumed_by_read;
  undefined1 local_58 [8];
  ReadResult result;
  size_t offset;
  CordRep *edge;
  CordRep **tree_local;
  size_t chunk_size_local;
  size_t n_local;
  CordRepBtreeReader *this_local;
  char *local_10;
  
  pCVar1 = CordRepBtreeNavigator::Current(&this->navigator_);
  if (pCVar1->length < chunk_size) {
    __assert_fail("chunk_size <= navigator_.Current()->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.cc"
                  ,0x20,
                  "absl::string_view absl::cord_internal::CordRepBtreeReader::Read(size_t, size_t, CordRep *&)"
                 );
  }
  if (chunk_size == 0) {
    pCVar1 = CordRepBtreeNavigator::Next(&this->navigator_);
    local_a0 = 0;
  }
  else {
    pCVar1 = CordRepBtreeNavigator::Current(&this->navigator_);
    local_a0 = pCVar1->length - chunk_size;
  }
  result.n = local_a0;
  _local_58 = CordRepBtreeNavigator::Read(&this->navigator_,local_a0,n);
  *tree = (CordRep *)local_58;
  if (n < chunk_size) {
    _consumed_by_read = EdgeData(pCVar1);
    _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&consumed_by_read,
                             (size_type)result.tree,0xffffffffffffffff);
  }
  else {
    local_70 = (n - chunk_size) - (long)result.tree;
    if (local_70 < this->remaining_) {
      pCVar1 = CordRepBtreeNavigator::Current(&this->navigator_);
      this->remaining_ = this->remaining_ - (local_70 + pCVar1->length);
      local_80 = EdgeData(pCVar1);
      _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_80,(size_type)result.tree,0xffffffffffffffff);
    }
    else {
      this->remaining_ = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    }
  }
  sVar2._M_len = (size_t)this_local;
  sVar2._M_str = local_10;
  return sVar2;
}

Assistant:

absl::string_view CordRepBtreeReader::Read(size_t n, size_t chunk_size,
                                           CordRep*& tree) {
  assert(chunk_size <= navigator_.Current()->length);

  // If chunk_size is non-zero, we need to start inside last returned edge.
  // Else we start reading at the next data edge of the tree.
  CordRep* edge = chunk_size ? navigator_.Current() : navigator_.Next();
  const size_t offset = chunk_size ? edge->length - chunk_size : 0;

  // Read the sub tree and verify we got what we wanted.
  ReadResult result = navigator_.Read(offset, n);
  tree = result.tree;

  // If the data returned in `tree` was covered entirely by `chunk_size`, i.e.,
  // read from the 'previous' edge, we did not consume any additional data, and
  // can directly return the substring into the current data edge as the next
  // chunk. We can easily establish from the above code that `navigator_.Next()`
  // has not been called as that requires `chunk_size` to be zero.
  if (n < chunk_size) return EdgeData(edge).substr(result.n);

  // The amount of data taken from the last edge is `chunk_size` and `result.n`
  // contains the offset into the current edge trailing the read data (which can
  // be 0). As the call to `navigator_.Read()` could have consumed all remaining
  // data, calling `navigator_.Current()` is not safe before checking if we
  // already consumed all remaining data.
  const size_t consumed_by_read = n - chunk_size - result.n;
  if (consumed_by_read >= remaining_) {
    remaining_ = 0;
    return {};
  }

  // We did not read all data, return remaining data from current edge.
  edge = navigator_.Current();
  remaining_ -= consumed_by_read + edge->length;
  return EdgeData(edge).substr(result.n);
}